

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O2

string * __thiscall
CSV::Writer<Protein>::EscapeStringForCSV
          (string *__return_storage_ptr__,Writer<Protein> *this,string *value)

{
  bool bVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  if ((value->_M_string_length != 0) &&
     (bVar1 = std::
              any_of<char_const*,CSV::Writer<Protein>::EscapeStringForCSV(std::__cxx11::string_const&)::_lambda(char)_1_>
                        (EscapeStringForCSV::escapingRequiredChars._M_elems,
                         "N6Alnout6WriterI7ProteinEE",(anon_class_8_1_a8c68091_for__M_pred)value),
     !bVar1)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string EscapeStringForCSV( const std::string& value ) {
    std::string ret = value;

    static const std::array< char, 4 > escapingRequiredChars = { ',', '\"', '\r', '\n' };

    bool needsEscaping =
      value.empty() ||
      std::any_of(
        escapingRequiredChars.begin(), escapingRequiredChars.end(),
        [&]( const char ch ) { return value.find( ch ) != std::string::npos; } );

    if( needsEscaping ) {
      ret.insert( 0, 1, '\"' );
      ret += '\"';
    }

    return ret;
  }